

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

void stbiw__jpg_calcBits(int val,unsigned_short *bits)

{
  uint uVar1;
  unsigned_short uVar2;
  
  uVar1 = -val;
  if (0 < val) {
    uVar1 = val;
  }
  uVar2 = 1;
  for (; 1 < uVar1; uVar1 = uVar1 >> 1) {
    uVar2 = uVar2 + 1;
  }
  bits[1] = uVar2;
  *bits = ~(ushort)(-1 << ((byte)uVar2 & 0x1f)) & (short)(val >> 0x1f) + (short)val;
  return;
}

Assistant:

static void stbiw__jpg_calcBits(int val, unsigned short bits[2]) {
  int tmp1 = val < 0 ? -val : val;
  val = val < 0 ? val - 1 : val;
  bits[1] = 1;
  while (tmp1 >>= 1) {
    ++bits[1];
  }
  bits[0] = val & ((1 << bits[1]) - 1);
}